

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QStringList * QFontDatabase::applicationFontFamilies(QStringList *__return_storage_ptr__,int id)

{
  QList<QFontDatabasePrivate::ApplicationFont::Properties> *this;
  Type *pTVar1;
  iterator args;
  iterator iVar2;
  Properties *properties;
  long in_FS_OFFSET;
  QDeadlineTimer QVar3;
  ApplicationFont local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)__return_storage_ptr__);
  if (pTVar1 != (Type *)0x0) {
    QVar3.t2 = 0xffffffff;
    QVar3.type = 0x7fffffff;
    QVar3.t1 = (qint64)pTVar1;
    QRecursiveMutex::tryLock(QVar3);
  }
  QFontDatabasePrivate::instance();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QFontDatabasePrivate::ApplicationFont>::value
            (&local_80,&QFontDatabasePrivate::instance::instance.applicationFonts,(long)id);
  QList<QString>::reserve(__return_storage_ptr__,local_80.properties.d.size);
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
            (&local_80.properties.d);
  if (&(local_80.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.data.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_80.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_80.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QList<QFontDatabasePrivate::ApplicationFont>::value
            (&local_80,&QFontDatabasePrivate::instance::instance.applicationFonts,(long)id);
  this = &local_80.properties;
  args = QList<QFontDatabasePrivate::ApplicationFont::Properties>::begin(this);
  iVar2 = QList<QFontDatabasePrivate::ApplicationFont::Properties>::end(this);
  for (; args.i != iVar2.i; args.i = args.i + 1) {
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &(args.i)->familyName);
    QList<QString>::end(__return_storage_ptr__);
  }
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer(&this->d)
  ;
  if (&(local_80.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.data.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_80.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_80.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pTVar1 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFontDatabase::applicationFontFamilies(int id)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *d = QFontDatabasePrivate::instance();

    QStringList ret;
    ret.reserve(d->applicationFonts.value(id).properties.size());

    for (const auto &properties : d->applicationFonts.value(id).properties)
        ret.append(properties.familyName);

    return ret;
}